

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsSolve(ARKodeMem ark_mem,N_Vector b,sunrealtype tnow,N_Vector ynow,N_Vector fnow,
              sunrealtype eRNrm,int mnewt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  SUNLinearSolver_Ops p_Var4;
  long lVar5;
  char *pcVar6;
  double dVar7;
  double local_70;
  sunrealtype gamrat;
  ARKLsMem arkls_mem;
  int dgamma_fail;
  int *jcur;
  sunrealtype gamma;
  
  iVar1 = arkLs_AccessLMem(ark_mem,"arkLsSolve",&arkls_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  arkls_mem->tcur = tnow;
  arkls_mem->ycur = ynow;
  arkls_mem->fcur = fnow;
  if (arkls_mem->iterative == 0) {
    local_70 = 0.0;
  }
  else {
    local_70 = eRNrm * arkls_mem->eplifac;
    dVar7 = (double)N_VWrmsNorm(b,ark_mem->rwt);
    if (dVar7 <= local_70) {
      if (0 < mnewt) {
        N_VConst(0,b);
      }
      goto LAB_0013f80e;
    }
    local_70 = local_70 * arkls_mem->nrmfac;
  }
  if (arkls_mem->LS->ops->setscalingvectors ==
      (_func_SUNErrCode_SUNLinearSolver_N_Vector_N_Vector *)0x0) {
    if (arkls_mem->iterative != 0) {
      N_VConst(0x3ff0000000000000,arkls_mem->x);
      dVar7 = (double)N_VWrmsNorm(ark_mem->rwt,arkls_mem->x);
      local_70 = local_70 / dVar7;
    }
  }
  else {
    iVar1 = SUNLinSolSetScalingVectors(arkls_mem->LS,ark_mem->rwt,ark_mem->ewt);
    if (iVar1 != 0) {
      arkProcessError(ark_mem,-0xc,0xd28,"arkLsSolve",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"Error in call to SUNLinSolSetScalingVectors");
      arkls_mem->last_flag = -0xc;
      return -0xc;
    }
  }
  N_VConst(0,arkls_mem->x);
  iVar1 = SUNLinSolSetZeroGuess(arkls_mem->LS,1);
  if (iVar1 != 0) {
    return -1;
  }
  if (arkls_mem->jtsetup != (ARKLsJacTimesSetupFn)0x0) {
    iVar1 = (*arkls_mem->jtsetup)(tnow,ynow,fnow,arkls_mem->Jt_data);
    arkls_mem->last_flag = iVar1;
    arkls_mem->njtsetup = arkls_mem->njtsetup + 1;
    if (iVar1 != 0) {
      pcVar6 = "The Jacobian x vector setup routine failed in an unrecoverable manner.";
      iVar2 = 0xd5f;
      goto LAB_0013f957;
    }
  }
  iVar2 = SUNLinSolSolve(local_70,arkls_mem->LS,arkls_mem->A,arkls_mem->x,b);
  N_VScale(0x3ff0000000000000,arkls_mem->x,b);
  if (arkls_mem->scalesol != 0) {
    iVar1 = (*ark_mem->step_getgammas)(ark_mem,&gamma,&gamrat,&jcur,&dgamma_fail);
    arkls_mem->last_flag = iVar1;
    if (iVar1 != 0) {
      pcVar6 = "An error occurred in ark_step_getgammas";
      iVar2 = 0xd73;
LAB_0013f957:
      arkProcessError(ark_mem,iVar1,iVar2,"arkLsSolve",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,pcVar6);
      return arkls_mem->last_flag;
    }
    if ((gamrat != 1.0) || (NAN(gamrat))) {
      N_VScale(2.0 / (gamrat + 1.0),b,b);
    }
  }
  if (arkls_mem->iterative == 0) {
LAB_0013f9cd:
    lVar5 = 0;
  }
  else {
    p_Var4 = arkls_mem->LS->ops;
    if (p_Var4->resnorm != (_func_sunrealtype_SUNLinearSolver *)0x0) {
      SUNLinSolResNorm();
      p_Var4 = arkls_mem->LS->ops;
    }
    if (p_Var4->numiters == (_func_int_SUNLinearSolver *)0x0) goto LAB_0013f9cd;
    iVar1 = SUNLinSolNumIters();
    lVar5 = (long)iVar1;
  }
  arkls_mem->nli = arkls_mem->nli + lVar5;
  if (iVar2 != 0) {
    arkls_mem->ncfl = arkls_mem->ncfl + 1;
    arkls_mem->last_flag = iVar2;
    uVar3 = iVar2 - 0x321;
    if (uVar3 < 8) {
      if ((0xf6U >> (uVar3 & 0x1f) & 1) != 0) {
        return 1;
      }
      if (uVar3 == 0) {
        return (uint)(mnewt != 0);
      }
    }
    if (iVar2 + 9999U < 2) {
      return -1;
    }
    if (iVar2 + 0x32bU < 2) {
      return -1;
    }
    if (iVar2 == -0x2705) {
      return -1;
    }
    if (iVar2 == -0x2703) {
      pcVar6 = "Failure in SUNLinSol external package";
      iVar2 = -0x2703;
      iVar1 = 0xdac;
    }
    else if (iVar2 == -0x328) {
      pcVar6 = "The preconditioner solve routine failed in an unrecoverable manner.";
      iVar2 = -0x328;
      iVar1 = 0xdb6;
    }
    else {
      if (iVar2 != -0x325) {
        return 0;
      }
      pcVar6 = "The Jacobian x vector routine failed in an unrecoverable manner.";
      iVar2 = -0x325;
      iVar1 = 0xdb1;
    }
    arkProcessError(ark_mem,iVar2,iVar1,"arkLsSolve",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,pcVar6);
    return -1;
  }
LAB_0013f80e:
  arkls_mem->last_flag = 0;
  return 0;
}

Assistant:

int arkLsSolve(ARKodeMem ark_mem, N_Vector b, sunrealtype tnow, N_Vector ynow,
               N_Vector fnow, sunrealtype eRNrm, int mnewt)
{
  sunrealtype bnorm;
  ARKLsMem arkls_mem;
  sunrealtype gamma, gamrat, delta, deltar, rwt_mean;
  sunbooleantype dgamma_fail, *jcur;
  int nli_inc, retval;

  /* used when logging is enabled */
  SUNDIALS_MAYBE_UNUSED long int nps_inc;
  SUNDIALS_MAYBE_UNUSED sunrealtype resnorm;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Set scalar tcur and vectors ycur and fcur for use by the
     Atimes and Psolve interface routines */
  arkls_mem->tcur = tnow;
  arkls_mem->ycur = ynow;
  arkls_mem->fcur = fnow;

  /* If the linear solver is iterative:
     test norm(b), if small, return x = 0 or x = b;
     set linear solver tolerance (in left/right scaled 2-norm) */
  if (arkls_mem->iterative)
  {
    deltar = arkls_mem->eplifac * eRNrm;
    bnorm  = N_VWrmsNorm(b, ark_mem->rwt);

    SUNLogInfo(ARK_LOGGER, "begin-linear-solve",
               "iterative = 1, b-norm = %.16g, b-tol = %.16g, res-tol = %.16g",
               bnorm, deltar, deltar * arkls_mem->nrmfac);

    if (bnorm <= deltar)
    {
      if (mnewt > 0) { N_VConst(ZERO, b); }
      arkls_mem->last_flag = ARKLS_SUCCESS;

      SUNLogInfo(ARK_LOGGER, "end-linear-solve", "status = success small rhs",
                 "");

      return (arkls_mem->last_flag);
    }
    /* Adjust tolerance for 2-norm */
    delta = deltar * arkls_mem->nrmfac;
  }
  else
  {
    delta = bnorm = ZERO;

    SUNLogInfo(ARK_LOGGER, "begin-linear-solve", "iterative = 0");
  }

  /* Set scaling vectors for LS to use (if applicable) */
  if (arkls_mem->LS->ops->setscalingvectors)
  {
    retval = SUNLinSolSetScalingVectors(arkls_mem->LS, ark_mem->rwt,
                                        ark_mem->ewt);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in call to SUNLinSolSetScalingVectors");
      arkls_mem->last_flag = ARKLS_SUNLS_FAIL;

      SUNLogInfo(ARK_LOGGER, "end-linear-solve",
                 "status = failed set scaling vectors");

      return (arkls_mem->last_flag);
    }

    /* If solver is iterative and does not support scaling vectors, update the
     tolerance in an attempt to account for ewt/rwt vectors.  We make the
     following assumptions:
       1. rwt_i = rwt_mean, for i=0,...,n-1 (i.e. the residual units are identical)
       2. the linear solver uses a basic 2-norm to measure convergence
     Hence (using the notation from sunlinsol_spgmr.h, with S = diag(rwt)),
           || bbar - Abar xbar ||_2 < tol
       <=> || S b - S A x ||_2 < tol
       <=> || S (b - A x) ||_2 < tol
       <=> \sum_{i=0}^{n-1} (rwt_i (b - A x)_i)^2 < tol^2
       <=> rwt_mean^2 \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2
       <=> \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2 / rwt_mean^2
       <=> || b - A x ||_2 < tol / rwt_mean
     So we compute rwt_mean = ||rwt||_RMS and scale the desired tolerance accordingly. */
  }
  else if (arkls_mem->iterative)
  {
    N_VConst(ONE, arkls_mem->x);
    rwt_mean = N_VWrmsNorm(ark_mem->rwt, arkls_mem->x);
    delta /= rwt_mean;
  }

  /* Set initial guess x = 0 to LS */
  N_VConst(ZERO, arkls_mem->x);

  /* Set zero initial guess flag */
  retval = SUNLinSolSetZeroGuess(arkls_mem->LS, SUNTRUE);
  if (retval != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-linear-solve", "status = failed set zero guess",
               "");
    return (-1);
  }

  /* Store previous nps value in nps_inc */
  nps_inc = arkls_mem->nps;

  /* If a user-provided jtsetup routine is supplied, call that here */
  if (arkls_mem->jtsetup)
  {
    arkls_mem->last_flag = arkls_mem->jtsetup(tnow, ynow, fnow,
                                              arkls_mem->Jt_data);
    arkls_mem->njtsetup++;
    if (arkls_mem->last_flag)
    {
      arkProcessError(ark_mem, arkls_mem->last_flag, __LINE__, __func__,
                      __FILE__, MSG_LS_JTSETUP_FAILED);

      SUNLogInfo(ARK_LOGGER, "end-linear-solve", "status = failed J-times setup");
      return (arkls_mem->last_flag);
    }
  }

  /* Call solver, and copy x to b */
  retval = SUNLinSolSolve(arkls_mem->LS, arkls_mem->A, arkls_mem->x, b, delta);
  N_VScale(ONE, arkls_mem->x, b);

  /* If using a direct or matrix-iterative solver, scale the correction to
     account for change in gamma (this is only beneficial if M==I) */
  if (arkls_mem->scalesol)
  {
    arkls_mem->last_flag = ark_mem->step_getgammas(ark_mem, &gamma, &gamrat,
                                                   &jcur, &dgamma_fail);
    if (arkls_mem->last_flag != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, arkls_mem->last_flag, __LINE__, __func__,
                      __FILE__, "An error occurred in ark_step_getgammas");
      return (arkls_mem->last_flag);
    }
    if (gamrat != ONE) { N_VScale(TWO / (ONE + gamrat), b, b); }
  }

  /* Retrieve statistics from iterative linear solvers */
  resnorm = ZERO;
  nli_inc = 0;
  if (arkls_mem->iterative)
  {
    if (arkls_mem->LS->ops->resnorm)
    {
      resnorm = SUNLinSolResNorm(arkls_mem->LS);
    }
    if (arkls_mem->LS->ops->numiters)
    {
      nli_inc = SUNLinSolNumIters(arkls_mem->LS);
    }
  }

  /* Increment counters nli and ncfl */
  arkls_mem->nli += nli_inc;
  if (retval != SUN_SUCCESS) { arkls_mem->ncfl++; }

  /* Interpret solver return value  */
  arkls_mem->last_flag = retval;

  SUNLogInfoIf(retval == SUN_SUCCESS, ARK_LOGGER, "end-linear-solve",
               "status = success, iters = %i, p-solves = %i, resnorm = %.16g",
               nli_inc, (int)(arkls_mem->nps - nps_inc), resnorm);
  SUNLogInfoIf(retval != SUN_SUCCESS, ARK_LOGGER,
               "end-linear-solve", "status = failed, retval = %i, iters = %i, p-solves = %i, resnorm = %.16g",
               retval, nli_inc, (int)(arkls_mem->nps - nps_inc), resnorm);

  switch (retval)
  {
  case SUN_SUCCESS: return (0); break;
  case SUNLS_RES_REDUCED:
    /* allow reduction but not solution on first nonlinear iteration,
       otherwise return with a recoverable failure */
    if (mnewt == 0) { return (0); }
    else { return (1); }
    break;
  case SUNLS_CONV_FAIL:
  case SUNLS_ATIMES_FAIL_REC:
  case SUNLS_PSOLVE_FAIL_REC:
  case SUNLS_PACKAGE_FAIL_REC:
  case SUNLS_QRFACT_FAIL:
  case SUNLS_LUFACT_FAIL: return (1); break;
  case SUN_ERR_ARG_CORRUPT:
  case SUN_ERR_ARG_INCOMPATIBLE:
  case SUN_ERR_MEM_FAIL:
  case SUNLS_GS_FAIL:
  case SUNLS_QRSOL_FAIL: return (-1); break;
  case SUN_ERR_EXT_FAIL:
    arkProcessError(ark_mem, SUN_ERR_EXT_FAIL, __LINE__, __func__, __FILE__,
                    "Failure in SUNLinSol external package");
    return (-1);
    break;
  case SUNLS_ATIMES_FAIL_UNREC:
    arkProcessError(ark_mem, SUNLS_ATIMES_FAIL_UNREC, __LINE__, __func__,
                    __FILE__, MSG_LS_JTIMES_FAILED);
    return (-1);
    break;
  case SUNLS_PSOLVE_FAIL_UNREC:
    arkProcessError(ark_mem, SUNLS_PSOLVE_FAIL_UNREC, __LINE__, __func__,
                    __FILE__, MSG_LS_PSOLVE_FAILED);
    return (-1);
    break;
  }

  return (0);
}